

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O0

void penguinV::AbsoluteDifference
               (Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,uint32_t startX2,
               uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t width,
               uint32_t height)

{
  bool bVar1;
  ImageTypeManager *this;
  FunctionTableHolder *pFVar2;
  reference puVar3;
  Image *pIVar4;
  Image *pIVar5;
  Image *pIVar6;
  undefined4 in_EDX;
  undefined4 in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000018;
  undefined4 in_stack_00000020;
  undefined4 in_stack_00000028;
  ImageManager manager;
  AbsoluteDifferenceForm4 funcTemp;
  const_iterator type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *types;
  uint8_t imageType;
  AbsoluteDifferenceForm4 func;
  ImageTypeManager *registrator;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe78;
  uint8_t requiredType;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  ImageTypeManager *in_stack_fffffffffffffeb8;
  ImageTypeManager *in_stack_fffffffffffffec0;
  ImageManager *this_00;
  FunctionTableHolder *in_stack_fffffffffffffee0;
  Image local_110 [3];
  char *in_stack_ffffffffffffff68;
  ImageManager *in_stack_ffffffffffffff70;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_80;
  undefined1 local_78 [24];
  undefined1 *local_60;
  uint8_t local_51;
  ImageManager *local_50;
  ImageTypeManager *local_48;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_30;
  undefined4 local_2c;
  ImageTemplate<unsigned_char> *local_28;
  
  local_40 = in_R9D;
  local_3c = in_R8D;
  local_30 = in_EDX;
  local_2c = in_ESI;
  local_28 = in_RDI;
  this = ImageTypeManager::instance();
  local_48 = this;
  PenguinV_Image::ImageTemplate<unsigned_char>::type(local_28);
  pFVar2 = ImageTypeManager::functionTable
                     (in_stack_fffffffffffffec0,(uint8_t)((ulong)in_stack_fffffffffffffeb8 >> 0x38))
  ;
  local_50 = (ImageManager *)pFVar2->AbsoluteDifference;
  local_51 = PenguinV_Image::ImageTemplate<unsigned_char>::type(local_28);
  if ((local_50 == (ImageManager *)0x0) &&
     (bVar1 = ImageTypeManager::isIntertypeConversionEnabled(local_48), bVar1)) {
    ImageTypeManager::imageTypes(in_stack_fffffffffffffeb8);
    local_60 = local_78;
    local_80._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                            (in_stack_fffffffffffffe78);
    while( true ) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend(in_stack_fffffffffffffe78);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_fffffffffffffe78);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator*(&local_80);
      in_stack_fffffffffffffee0 =
           ImageTypeManager::functionTable
                     (in_stack_fffffffffffffec0,(uint8_t)((ulong)in_stack_fffffffffffffeb8 >> 0x38))
      ;
      in_stack_ffffffffffffff70 = (ImageManager *)in_stack_fffffffffffffee0->AbsoluteDifference;
      if (in_stack_ffffffffffffff70 != (ImageManager *)0x0) {
        local_50 = in_stack_ffffffffffffff70;
        puVar3 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*(&local_80);
        local_51 = *puVar3;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&local_80);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  }
  requiredType = (uint8_t)((ulong)in_stack_fffffffffffffe78 >> 0x38);
  (anonymous_namespace)::
  verifyFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pIVar5 = local_110;
  anon_unknown.dwarf_84a6f::ImageManager::ImageManager
            ((ImageManager *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             requiredType);
  this_00 = local_50;
  pIVar4 = anon_unknown.dwarf_84a6f::ImageManager::operator()(local_50,pIVar5);
  pIVar5 = anon_unknown.dwarf_84a6f::ImageManager::operator()(this_00,pIVar5);
  pIVar6 = anon_unknown.dwarf_84a6f::ImageManager::operator()
                     ((ImageManager *)this,(Image *)in_stack_fffffffffffffee0);
  (*(code *)this_00)(pIVar4,local_2c,local_30,pIVar5,local_3c,local_40,pIVar6,in_stack_00000010,
                     in_stack_00000018,in_stack_00000020,in_stack_00000028);
  anon_unknown.dwarf_84a6f::ImageManager::~ImageManager((ImageManager *)CONCAT44(local_30,local_2c))
  ;
  return;
}

Assistant:

void AbsoluteDifference( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                             Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height )
    {
        initialize( in1, AbsoluteDifference )
        func( manager(in1), startX1, startY1, manager(in2), startX2, startY2, manager(out), startXOut, startYOut, width, height );
    }